

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::value(Fl_Help_View *this,char *val)

{
  char *pcVar1;
  char *val_local;
  Fl_Help_View *this_local;
  
  clear_selection(this);
  free_data(this);
  Fl_Widget::set_changed((Fl_Widget *)this);
  if (val != (char *)0x0) {
    pcVar1 = strdup(val);
    this->value_ = pcVar1;
    initial_load = '\x01';
    format(this);
    initial_load = '\0';
    topline(this,0);
    leftline(this,0);
  }
  return;
}

Assistant:

void
Fl_Help_View::value(const char *val)	// I - Text to view
{
  clear_selection();
  free_data();
  set_changed();

  if (!val)
    return;

  value_ = strdup(val);

  initial_load = 1;
  format();
  initial_load = 0;

  topline(0);
  leftline(0);
}